

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco-dump.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  FILE *f;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *puVar5;
  char **ppcVar6;
  int iVar7;
  string outdir;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RCO rco;
  ulong *local_270;
  undefined8 local_268;
  ulong local_260;
  undefined8 uStack_258;
  char *local_250;
  long local_248;
  char local_240 [16];
  char *local_230;
  long local_228;
  char local_220 [16];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  string local_1d0;
  RCO local_1b0;
  
  local_230 = local_220;
  local_228 = 0;
  local_220[0] = '\0';
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,".","");
  if (0 < argc) {
    uVar4 = 0;
    do {
      pcVar1 = argv[uVar4];
      if (((pcVar1 != (char *)0x0) && (sVar2 = strlen(pcVar1), 2 < (int)sVar2)) && (*pcVar1 == '-'))
      {
        __s = pcVar1 + 2;
        ppcVar6 = &local_230;
        if ((pcVar1[1] == 'f') || (ppcVar6 = &local_250, *__s == 'd')) {
          pcVar1 = ppcVar6[1];
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)ppcVar6,0,pcVar1,(ulong)__s);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
  }
  if (local_228 == 0) {
    iVar7 = 1;
    if (argc < 2) goto LAB_001038f4;
    pcVar1 = argv[1];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,(ulong)pcVar1);
    if (local_228 == 0) goto LAB_001038f4;
  }
  f = fopen(local_230,"rb");
  if (f == (FILE *)0x0) {
    iVar7 = 1;
    goto LAB_001038f4;
  }
  RCO::RCO(&local_1b0,(FILE *)f);
  if (local_230[1] == ':') {
    std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_230);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_270);
    puVar5 = local_270;
    if (local_270 != &local_260) {
LAB_001037f5:
      operator_delete(puVar5);
    }
  }
  else {
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_250,local_250 + local_248);
    std::__cxx11::string::append((char *)&local_210);
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&local_230);
    uVar4 = 0xf;
    if (local_210 != local_200) {
      uVar4 = local_200[0];
    }
    if (uVar4 < (ulong)(local_1e8 + local_208)) {
      uVar4 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar4 = local_1e0[0];
      }
      if (uVar4 < (ulong)(local_1e8 + local_208)) goto LAB_001039cf;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_001039cf:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_270 = &local_260;
    puVar5 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar5) {
      local_260 = *puVar5;
      uStack_258 = puVar3[3];
    }
    else {
      local_260 = *puVar5;
      local_270 = (ulong *)*puVar3;
    }
    local_268 = puVar3[1];
    *puVar3 = puVar5;
    puVar3[1] = 0;
    *(undefined1 *)puVar5 = 0;
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_270);
    if (local_270 != &local_260) {
      operator_delete(local_270);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    puVar5 = local_210;
    if (local_210 != local_200) goto LAB_001037f5;
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_250,local_250 + local_248);
  RCO::dump(&local_1b0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOElement>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1b0.mStringTable._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RCOFileData>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1b0.mFiles._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_RCOElement>,_std::allocator<std::pair<const_int,_RCOElement>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1b0.mElements._M_h);
  std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_1b0.mRootElement.children);
  std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_1b0.mRootElement.siblings);
  std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::~vector
            (&local_1b0.mRootElement.attributes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.mRootElement.name._M_dataplus._M_p != &local_1b0.mRootElement.name.field_2) {
    operator_delete(local_1b0.mRootElement.name._M_dataplus._M_p);
  }
  iVar7 = 0;
LAB_001038f4:
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *f;
	std::string file;
	std::string outdir = ".";

	// Loop over arguments and handle accordingly.
	// -fINPUT_FILE
	// -dOUTPUT_DIR
	for (int i = 0; i < argc; i++)
	{
		if (argv[i] != nullptr)
		{
			int arglen = strlen(argv[i]);
			if (arglen > 2)
			{
				if (argv[i][0] == '-' && argv[i][1] == 'f')
				{
					file = &argv[i][2];
				}
				else if (argv[i][0] == '-' && argv[i][2] == 'd')
				{
					outdir = &argv[i][2];
				}
			}
		}
	}

	// If no -f or -d, attempt to parse any >1 args as input files, 
	// allows to keep supporting drag&drop on windows
	if (file.empty())
	{
		if (argc > 1)
			file = argv[1];
		
		if (file.empty())
			return 1;	
	}

	f = fopen(file.c_str(), "rb");
	if (!f)
		return 1;

	// Got an absolute file
	RCO rco(f);
	
	if (file[1] == ':')
		outdir = file.substr(0, file.length() - 4);
	else
		outdir = outdir + "/" + file.substr(0, file.length() - 4);
	rco.dump(outdir);

    return 0;
}